

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O1

void check_improve(CHAR_DATA *ch,int sn,bool success,int multiplier)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  CClass *this;
  short sVar6;
  short sVar7;
  char *pcVar8;
  long lVar9;
  float fVar10;
  char buf [100];
  float local_9c;
  char local_98 [104];
  
  bVar2 = is_npc(ch);
  if (bVar2) {
    return;
  }
  bVar2 = is_affected_by(ch,0x16);
  if (bVar2) {
    return;
  }
  sVar7 = ch->level;
  lVar9 = (long)sn;
  this = ch->my_class;
  if ((this == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
    this = CClass::GetClass(0);
  }
  iVar3 = CClass::GetIndex(this);
  if (sVar7 < *(short *)(lVar9 * 0x60 + 0x45a788 + (long)iVar3 * 2)) {
    return;
  }
  if ((ushort)(ch->pcdata->learned[lVar9] - 100U) < 0xffa7) {
    return;
  }
  iVar3 = get_curr_stat(ch,1);
  local_9c = (float)(ch->level * 2) +
             (float)((int)int_app[iVar3].learn << 3) / (float)(multiplier << 2);
  if (((uint)ch->act[0] >> 0x15 & 1) != 0) {
    local_9c = local_9c * 0.25;
  }
  bVar2 = is_affected(ch,(int)gsn_synaptic_enhancement);
  if (bVar2) {
    local_9c = local_9c * 1.5;
  }
  bVar2 = is_affected(ch,(int)gsn_synaptic_impairment);
  if (bVar2) {
    local_9c = local_9c * 0.5;
  }
  iVar3 = number_range(1,1000);
  if (local_9c < (float)iVar3) {
    return;
  }
  sVar7 = ch->pcdata->learned[lVar9];
  if (!success) {
    if (sVar7 < 10) {
      fVar10 = 5.0;
    }
    else if (sVar7 < 0x3e) {
      fVar10 = (float)((int)(short)(sVar7 - (sVar7 >> 0xf)) >> 1);
    }
    else {
      fVar10 = 30.0;
    }
    iVar3 = number_range(1,3);
    iVar5 = number_percent();
    if (fVar10 <= (float)iVar5) {
      return;
    }
    uVar4 = (uint)ch->comm[0];
    if ((uVar4 >> 10 & 1) == 0) {
LAB_002c4496:
      if (ch->pcdata->learned[lVar9] + iVar3 < 100) {
        pcVar8 = "You learn from your mistakes, and your %s skill improves.\n\r";
        goto LAB_002c45d3;
      }
      if ((uVar4 >> 10 & 1) != 0) goto LAB_002c453e;
LAB_002c45b3:
      if (iVar3 + ch->pcdata->learned[lVar9] == 100) {
        pcVar8 = "You learn from your mistakes, and manage to perfect %s!\n\r";
        goto LAB_002c45d3;
      }
    }
    else {
      if (ch->pcdata->learned[lVar9] + iVar3 < 100) {
        pcVar8 = "\x1b[1;33mYou learn from your mistakes, and your %s skill improves.\x1b[0m\n\r";
      }
      else {
        if ((uVar4 >> 10 & 1) == 0) goto LAB_002c4496;
LAB_002c453e:
        if (ch->pcdata->learned[lVar9] + iVar3 != 100) {
          if ((uVar4 >> 10 & 1) == 0) goto LAB_002c45b3;
          goto LAB_002c45e3;
        }
        pcVar8 = "\x1b[1;33mYou learn from your mistakes, and manage to perfect %s!\x1b[0m\n\r";
      }
LAB_002c45d3:
      sprintf(local_98,pcVar8,skill_table[lVar9].name);
    }
LAB_002c45e3:
    send_to_char(local_98,ch);
    sVar6 = ch->pcdata->learned[lVar9] + (short)iVar3;
    sVar7 = 100;
    if (sVar6 < 100) {
      sVar7 = sVar6;
    }
    ch->pcdata->learned[lVar9] = sVar7;
    goto LAB_002c4618;
  }
  if (sVar7 < 0x60) {
    if (sVar7 < 5) {
      fVar10 = 95.0;
    }
    else {
      fVar10 = (float)(100 - sVar7);
    }
  }
  else {
    fVar10 = 5.0;
  }
  iVar3 = number_percent();
  if (fVar10 <= (float)iVar3) {
    return;
  }
  uVar4 = (uint)ch->comm[0];
  if ((uVar4 >> 10 & 1) == 0) {
LAB_002c4422:
    if (ch->pcdata->learned[lVar9] < 99) {
      pcVar8 = "You have become better at %s!\n\r";
      goto LAB_002c457e;
    }
    if ((uVar4 >> 10 & 1) != 0) goto LAB_002c4518;
LAB_002c4564:
    if (ch->pcdata->learned[lVar9] == 99) {
      pcVar8 = "You have perfected %s!\n\r";
      goto LAB_002c457e;
    }
  }
  else {
    if (ch->pcdata->learned[lVar9] < 99) {
      pcVar8 = "\x1b[1;33mYou have become better at %s!\x1b[0m\n\r";
    }
    else {
      if ((uVar4 >> 10 & 1) == 0) goto LAB_002c4422;
LAB_002c4518:
      if (ch->pcdata->learned[lVar9] != 99) {
        if ((uVar4 >> 10 & 1) == 0) goto LAB_002c4564;
        goto LAB_002c458e;
      }
      pcVar8 = "\x1b[1;33mYou have perfected %s!\x1b[0m\n\r";
    }
LAB_002c457e:
    sprintf(local_98,pcVar8,skill_table[lVar9].name);
  }
LAB_002c458e:
  send_to_char(local_98,ch);
  psVar1 = ch->pcdata->learned + lVar9;
  *psVar1 = *psVar1 + 1;
LAB_002c4618:
  gain_exp(ch,4);
  return;
}

Assistant:

void check_improve(CHAR_DATA *ch, int sn, bool success, int multiplier)
{
	int inum;
	float chance;
	char buf[100];

	if (is_npc(ch))
		return;

	if (is_affected_by(ch, AFF_CALM))
		return;

	if (ch->level < skill_table[sn].skill_level[ch->Class()->GetIndex()]
		|| ch->pcdata->learned[sn] <= 10
		|| ch->pcdata->learned[sn] >= 100)
	{
		return; /* skill is not known */
	}

	/* check to see if the character has a chance to learn */
	chance = 8 * int_app[get_curr_stat(ch, STAT_INT)].learn;
	chance /= (multiplier * 4);
	chance += ch->level * 2;

	if (IS_SET(ch->act, PLR_MORON))
		chance /= 4;

	if (is_affected(ch, gsn_synaptic_enhancement))
		chance *= 1.5;

	if (is_affected(ch, gsn_synaptic_impairment))
		chance /= 2;

	if (number_range(1, 1000) > chance)
		return;

	/* now that the character has a CHANCE to learn, see if they really have */

	if (success)
	{
		chance = URANGE(5, 100 - ch->pcdata->learned[sn], 95);

		if (number_percent() < chance)
		{
			if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] < 99)
				sprintf(buf, "[1;33mYou have become better at %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] < 99)
				sprintf(buf, "You have become better at %s!\n\r", skill_table[sn].name);
			else if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] == 99)
				sprintf(buf, "[1;33mYou have perfected %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] == 99)
				sprintf(buf, "You have perfected %s!\n\r", skill_table[sn].name);

			send_to_char(buf, ch);
			ch->pcdata->learned[sn]++;
			gain_exp(ch, 4);
		}
	}
	else
	{
		chance = URANGE(5, ch->pcdata->learned[sn] / 2, 30);
		inum = number_range(1, 3);

		if (number_percent() < chance)
		{
			if (IS_SET(ch->comm, COMM_ANSI) && (ch->pcdata->learned[sn] + inum) < 100)
				sprintf(buf, "[1;33mYou learn from your mistakes, and your %s skill improves.[0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && (ch->pcdata->learned[sn] + inum) < 100)
				sprintf(buf, "You learn from your mistakes, and your %s skill improves.\n\r", skill_table[sn].name);
			else if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] + inum == 100)
				sprintf(buf, "[1;33mYou learn from your mistakes, and manage to perfect %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] + inum == 100)
				sprintf(buf, "You learn from your mistakes, and manage to perfect %s!\n\r", skill_table[sn].name);

			send_to_char(buf, ch);
			ch->pcdata->learned[sn] += inum;
			ch->pcdata->learned[sn] = std::min((int)ch->pcdata->learned[sn], 100);
			gain_exp(ch, 4);
		}
	}
}